

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void vdbeMemClearExternAndSetNull(Mem *p)

{
  if ((p->flags & 0x2000) != 0) {
    sqlite3VdbeMemFinalize(p,(p->u).pDef);
  }
  if ((p->flags & 0x400) != 0) {
    (*p->xDel)(p->z);
  }
  p->flags = 1;
  return;
}

Assistant:

static SQLITE_NOINLINE void vdbeMemClearExternAndSetNull(Mem *p){
  assert( p->db==0 || sqlite3_mutex_held(p->db->mutex) );
  assert( VdbeMemDynamic(p) );
  if( p->flags&MEM_Agg ){
    sqlite3VdbeMemFinalize(p, p->u.pDef);
    assert( (p->flags & MEM_Agg)==0 );
    testcase( p->flags & MEM_Dyn );
  }
  if( p->flags&MEM_Dyn ){
    assert( p->xDel!=SQLITE_DYNAMIC && p->xDel!=0 );
    p->xDel((void *)p->z);
  }
  p->flags = MEM_Null;
}